

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O3

parser_error parse_pit_flags_ban(parser *p)

{
  _Bool _Var1;
  errr eVar2;
  void *pvVar3;
  char *pcVar4;
  char *flag_name;
  parser_error pVar5;
  
  pvVar3 = parser_priv(p);
  if (pvVar3 == (void *)0x0) {
    pVar5 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    _Var1 = parser_hasval(p,"flags");
    pVar5 = PARSE_ERROR_NONE;
    if (_Var1) {
      pcVar4 = parser_getstr(p,"flags");
      pcVar4 = string_make(pcVar4);
      flag_name = strtok(pcVar4," |");
      if (flag_name == (char *)0x0) {
        pVar5 = PARSE_ERROR_NONE;
      }
      else {
        do {
          eVar2 = grab_flag((bitflag *)((long)pvVar3 + 0x34),0xc,r_info_flags,flag_name);
          if (eVar2 != 0) {
            pVar5 = PARSE_ERROR_INVALID_FLAG;
            break;
          }
          pVar5 = PARSE_ERROR_NONE;
          flag_name = strtok((char *)0x0," |");
        } while (flag_name != (char *)0x0);
      }
      mem_free(pcVar4);
    }
  }
  return pVar5;
}

Assistant:

static enum parser_error parse_pit_flags_ban(struct parser *p) {
	struct pit_profile *pit = parser_priv(p);
	char *flags;
	char *s;

	if (!pit)
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	if (!parser_hasval(p, "flags"))
		return PARSE_ERROR_NONE;
	flags = string_make(parser_getstr(p, "flags"));
	s = strtok(flags, " |");
	while (s) {
		if (grab_flag(pit->forbidden_flags, RF_SIZE, r_info_flags, s)) {
			mem_free(flags);
			return PARSE_ERROR_INVALID_FLAG;
		}
		s = strtok(NULL, " |");
	}
	
	mem_free(flags);
	return PARSE_ERROR_NONE;
}